

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

int Ivy_ManCleanupSeq(Ivy_Man_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  Ivy_Obj_t *pIVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  void *pvVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x10;
  pVVar9 = p->vPis;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      puVar7 = (uint *)((long)pVVar9->pArray[lVar6] + 8);
      *puVar7 = *puVar7 | 0x10;
      lVar6 = lVar6 + 1;
      pVVar9 = p->vPis;
    } while (lVar6 < pVVar9->nSize);
  }
  pVVar9 = p->vPos;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      Ivy_ManCleanupSeq_rec((Ivy_Obj_t *)pVVar9->pArray[lVar6]);
      lVar6 = lVar6 + 1;
      pVVar9 = p->vPos;
    } while (lVar6 < pVVar9->nSize);
  }
  puVar7 = (uint *)malloc(0x10);
  puVar7[0] = 100;
  puVar7[1] = 0;
  pvVar8 = malloc(800);
  *(void **)(puVar7 + 2) = pvVar8;
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      pvVar8 = pVVar9->pArray[lVar6];
      if (pvVar8 != (void *)0x0) {
        if ((*(uint *)((long)pvVar8 + 8) & 0x10) == 0) {
          uVar15 = puVar7[1];
          uVar2 = *puVar7;
          if (uVar15 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (*(void **)(puVar7 + 2) == (void *)0x0) {
                pvVar10 = malloc(0x80);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar7 + 2),0x80);
              }
              uVar11 = 0x10;
            }
            else {
              uVar11 = uVar2 * 2;
              if ((int)uVar11 <= (int)uVar2) goto LAB_007eb031;
              if (*(void **)(puVar7 + 2) == (void *)0x0) {
                pvVar10 = malloc((ulong)uVar2 << 4);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar7 + 2),(ulong)uVar2 << 4);
              }
            }
            *(void **)(puVar7 + 2) = pvVar10;
            *puVar7 = uVar11;
          }
LAB_007eb031:
          puVar7[1] = uVar15 + 1;
          *(void **)(*(long *)(puVar7 + 2) + (long)(int)uVar15 * 8) = pvVar8;
        }
        else {
          *(uint *)((long)pvVar8 + 8) = *(uint *)((long)pvVar8 + 8) & 0xffffffef;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar9 = p->vObjs;
    } while (lVar6 < pVVar9->nSize);
  }
  uVar15 = puVar7[1];
  uVar16 = (ulong)uVar15;
  if (uVar16 == 0) {
    pvVar8 = *(void **)(puVar7 + 2);
    uVar15 = 0;
  }
  else {
    if (0 < (int)uVar15) {
      lVar6 = *(long *)(puVar7 + 2);
      uVar14 = 0;
      do {
        Ivy_ObjDisconnect(p,*(Ivy_Obj_t **)(lVar6 + uVar14 * 8));
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    if (0 < (int)uVar15) {
      lVar6 = *(long *)(puVar7 + 2);
      uVar14 = 0;
      do {
        pIVar4 = *(Ivy_Obj_t **)(lVar6 + uVar14 * 8);
        if ((*(uint *)&pIVar4->field_0x8 & 0xc) != 4) {
          __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                        ,0x158,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
        }
        if (pIVar4->nRefs != 0) {
          __assert_fail("Ivy_ObjRefs(pObj) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                        ,0x159,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
        }
        p->nObjs[*(uint *)&pIVar4->field_0x8 & 0xf] =
             p->nObjs[*(uint *)&pIVar4->field_0x8 & 0xf] + -1;
        p->nDeleted = p->nDeleted + 1;
        if ((p->fFanout != 0) && ((*(uint *)&pIVar4->field_0x8 & 0xf) == 7)) {
          pVVar9 = p->vBufs;
          uVar2 = pVVar9->nSize;
          lVar13 = (ulong)uVar2 + 1;
          do {
            if ((int)lVar13 + -1 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            lVar12 = lVar13 + -1;
            lVar5 = lVar13 + -2;
            lVar13 = lVar12;
          } while ((Ivy_Obj_t *)pVVar9->pArray[lVar5] != pIVar4);
          for (; (int)lVar12 < (int)uVar2; lVar12 = lVar12 + 1) {
            pVVar9->pArray[lVar12 + -1] = pVVar9->pArray[lVar12];
          }
          pVVar9->nSize = uVar2 - 1;
        }
        iVar3 = pIVar4->Id;
        if (((long)iVar3 < 0) || (p->vObjs->nSize <= iVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        p->vObjs->pArray[iVar3] = (void *)0x0;
        pIVar4->field_0x8 = pIVar4->field_0x8 & 0xf0;
        *(Ivy_Obj_t **)pIVar4 = p->pListFree;
        p->pListFree = pIVar4;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar16);
    }
    pvVar8 = *(void **)(puVar7 + 2);
  }
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
    puVar7[2] = 0;
    puVar7[3] = 0;
  }
  free(puVar7);
  return uVar15;
}

Assistant:

int Ivy_ManCleanupSeq( Ivy_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    int i, RetValue;
    // mark the constant and PIs
    Ivy_ObjSetMarkA( Ivy_ManConst1(p) );
    Ivy_ManForEachPi( p, pObj, i )
        Ivy_ObjSetMarkA( pObj );
    // mark nodes visited from POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManCleanupSeq_rec( pObj );
    // collect unmarked nodes
    vNodes = Vec_PtrAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjIsMarkA(pObj) )
            Ivy_ObjClearMarkA(pObj);
        else
            Vec_PtrPush( vNodes, pObj );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", 0 );
        return 0;
    }
    // disconnect the marked objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
        Ivy_ObjDisconnect( p, pObj );
    // remove the dangling objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
    {
        assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj) );
        assert( Ivy_ObjRefs(pObj) == 0 );
        // update node counters of the manager
        p->nObjs[pObj->Type]--;
        p->nDeleted++;
        // delete buffer from the array of buffers
        if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
            Vec_PtrRemove( p->vBufs, pObj );
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    // return the number of nodes freed
    RetValue = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", RetValue );
    return RetValue;
}